

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76489.c
# Opt level: O0

SN76489_Context * SN76489_Init(UINT32 PSGClockValue,UINT32 SamplingRate)

{
  SN76489_Context *chip_00;
  SN76489_Context *chip;
  int i;
  UINT32 SamplingRate_local;
  UINT32 PSGClockValue_local;
  
  chip_00 = (SN76489_Context *)calloc(1,200);
  if (chip_00 != (SN76489_Context *)0x0) {
    chip_00->dClock = ((float)PSGClockValue * 0.0625) / (float)SamplingRate;
    SN76489_SetMute(chip_00,0xf);
    SN76489_Config(chip_00,9,'\x10');
    for (chip._4_4_ = 0; chip._4_4_ < 4; chip._4_4_ = chip._4_4_ + 1) {
      Panning_Centre(chip_00->panning[chip._4_4_]);
    }
    chip_00->NgpFlags = '\0';
    chip_00->NgpChip2 = (SN76489_Context *)0x0;
  }
  return chip_00;
}

Assistant:

static SN76489_Context* SN76489_Init( UINT32 PSGClockValue, UINT32 SamplingRate)
{
	int i;
	SN76489_Context* chip = (SN76489_Context*)calloc(1, sizeof(SN76489_Context));
	if(chip)
	{
		chip->dClock=(float)PSGClockValue/16.0f/SamplingRate;
		
		SN76489_SetMute(chip, MUTE_ALLON);
		SN76489_Config(chip, FB_SEGAVDP, SRW_SEGAVDP);
		
		for( i = 0; i < 4; i++ )
			Panning_Centre(chip->panning[i]);
		//SN76489_Reset(chip);
		
		chip->NgpFlags = 0x00;
		chip->NgpChip2 = NULL;
	}
	return chip;
}